

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPageTableMgr.cpp
# Opt level: O2

void __thiscall GmmLib::GmmPageTableMgr::GmmPageTableMgr(GmmPageTableMgr *this)

{
  this->_vptr_GmmPageTableMgr = (_func_int **)&PTR_GetAuxL3TableAddr_001d3bf0;
  this->pClientContext = (GmmClientContext *)0x0;
  this->hCsr = (HANDLE)0x0;
  this->NumNodePoolElements = 0;
  this->AuxTTObj = (AuxTable *)0x0;
  this->pPool = (GMM_PAGETABLEPool *)0x0;
  (this->DeviceCb).pBufferMgr = (void *)0x0;
  *(undefined8 *)&(this->DeviceCb).FuncDevice = 0;
  (this->DeviceCb).pfnAllocate =
       (_func_int_void_ptr_size_t_size_t_void_ptr_ptr_void_ptr_ptr_uint64_t_ptr *)0x0;
  (this->DeviceCb).pfnDeallocate = (_func_void_void_ptr *)0x0;
  (this->DeviceCb).pfnWaitFromCpu = (_func_void_void_ptr *)0x0;
  (this->DeviceCbInt).pBufMgr = (void *)0x0;
  (this->DeviceCbInt).DevCbPtrs_.pfnAllocate =
       (_func_int_void_ptr_size_t_size_t_void_ptr_ptr_void_ptr_ptr_uint64_t_ptr *)0x0;
  (this->DeviceCbInt).DevCbPtrs_.pfnDeallocate = (_func_void_void_ptr *)0x0;
  (this->DeviceCbInt).DevCbPtrs_.pfnWaitFromCpu = (_func_void_void_ptr *)0x0;
  return;
}

Assistant:

GmmLib::GmmPageTableMgr::GmmPageTableMgr()
{
    this->AuxTTObj            = NULL;
    this->pPool               = NULL;
    this->NumNodePoolElements = 0;
    this->pClientContext      = NULL;
    this->hCsr                = NULL;

    memset(&DeviceCb, 0, sizeof(GMM_DEVICE_CALLBACKS));
    memset(&DeviceCbInt, 0, sizeof(GMM_DEVICE_CALLBACKS_INT));
}